

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O1

set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
* __thiscall
ThreadRegion::llvmInstructions
          (set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
           *__return_storage_ptr__,ThreadRegion *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Instruction *in_RAX;
  _Rb_tree_node_base *p_Var3;
  Instruction *local_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = in_RAX;
  for (p_Var3 = (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = Node::isArtificial(*(Node **)(p_Var3 + 1));
    if (!bVar2) {
      local_28 = Node::llvmInstruction(*(Node **)(p_Var3 + 1));
      std::
      _Rb_tree<llvm::Instruction_const*,llvm::Instruction_const*,std::_Identity<llvm::Instruction_const*>,std::less<llvm::Instruction_const*>,std::allocator<llvm::Instruction_const*>>
      ::_M_insert_unique<llvm::Instruction_const*>
                ((_Rb_tree<llvm::Instruction_const*,llvm::Instruction_const*,std::_Identity<llvm::Instruction_const*>,std::less<llvm::Instruction_const*>,std::allocator<llvm::Instruction_const*>>
                  *)__return_storage_ptr__,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const llvm::Instruction *> ThreadRegion::llvmInstructions() const {
    std::set<const llvm::Instruction *> llvmValues;
    for (const auto &node : nodes_) {
        if (!node->isArtificial()) {
            llvmValues.insert(node->llvmInstruction());
        }
    }
    return llvmValues;
}